

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O1

void delete_monster_idx(chunk *c,wchar_t m_idx)

{
  uint32_t *puVar1;
  loc lVar2;
  heatmap hVar3;
  object *poVar4;
  ghost_info *pgVar5;
  _Bool _Var6;
  monster_conflict *mon;
  monster_race *pmVar7;
  monster_conflict *pmVar8;
  monster_lore *pmVar9;
  chunk *p_c;
  object *local_40;
  loc local_38;
  
  mon = (monster_conflict *)cave_monster((chunk_conflict *)c,m_idx);
  if (m_idx < L'\x01') {
    __assert_fail("m_idx > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x38a,"void delete_monster_idx(struct chunk *, int)");
  }
  _Var6 = square_in_bounds((chunk_conflict *)c,mon->grid);
  if (_Var6) {
    pmVar7 = mon->original_race;
    if (pmVar7 == (monster_race *)0x0) {
      pmVar7 = mon->race;
    }
    lVar2 = mon->grid;
    pmVar7->cur_num = pmVar7->cur_num + L'\xffffffff';
    _Var6 = flag_has_dbg(mon->race->flags,0xc,0x17,"mon->race->flags","RF_MULTIPLY");
    if (_Var6) {
      c->num_repro = c->num_repro + L'\xffffffff';
    }
    if (mon->race->light != L'\0') {
      puVar1 = &player->upkeep->update;
      *puVar1 = *puVar1 | 0xc0;
    }
    pmVar8 = (monster_conflict *)target_get_monster();
    if (pmVar8 == mon) {
      target_set_monster((monster *)0x0);
    }
    if ((monster_conflict *)player->upkeep->health_who == mon) {
      health_track(player->upkeep,(monster *)0x0);
    }
    if (mon->m_timed[8] != 0) {
      player_clear_timed(player,L',',true,true);
    }
    square_set_mon((chunk_conflict *)c,lVar2,L'\0');
    monster_remove_from_groups((chunk_conflict *)c,(monster *)mon);
    monster_remove_from_targets(c,mon);
    hVar3.grids = (mon->noise).grids;
    if (hVar3.grids != (uint16_t **)0x0) {
      heatmap_free((chunk_conflict *)c,hVar3);
    }
    hVar3.grids = (mon->scent).grids;
    local_38 = lVar2;
    if (hVar3.grids != (uint16_t **)0x0) {
      heatmap_free((chunk_conflict *)c,hVar3);
    }
    local_40 = mon->held_obj;
    if (local_40 != (object *)0x0) {
      do {
        poVar4 = local_40->next;
        if (local_40->artifact != (artifact *)0x0) {
          _Var6 = obj_is_known_artifact(local_40);
          if (!_Var6) {
            mark_artifact_created(local_40->artifact,false);
          }
        }
        if (local_40->known != (object *)0x0) {
          _Var6 = loc_is_zero((loc_conflict)local_40->known->grid);
          if ((_Var6) && ((chunk *)cave == c)) {
            delist_object((chunk_conflict *)player->cave,local_40->known);
            object_delete((chunk *)player->cave,(chunk *)0x0,&local_40->known);
          }
        }
        delist_object((chunk_conflict *)c,local_40);
        if (player == (player *)0x0) {
          p_c = (chunk *)0x0;
        }
        else {
          p_c = (chunk *)0x0;
          if ((chunk *)cave == c) {
            p_c = (chunk *)player->cave;
          }
        }
        object_delete(c,p_c,&local_40);
        local_40 = poVar4;
      } while (poVar4 != (object *)0x0);
    }
    if (mon->mimicked_obj != (object *)0x0) {
      square_delete_object((chunk_conflict *)c,mon->grid,mon->mimicked_obj,true,false);
    }
    _Var6 = flag_has_dbg(mon->race->flags,0xc,2,"mon->race->flags","RF_PLAYER_GHOST");
    lVar2 = local_38;
    if (_Var6) {
      pmVar9 = get_lore(mon->race);
      pmVar9->sights = 0;
      pmVar9->deaths = 0;
      pmVar9->pkills = 0;
      pmVar9->tkills = 0;
      if (player->upkeep->monster_race == mon->race) {
        player->upkeep->monster_race = (monster_race *)0x0;
      }
      pgVar5 = c->ghost;
      pgVar5->bones_selector = L'\0';
      pgVar5->has_spoken = false;
      pgVar5->string_type = L'\0';
      my_strcpy(pgVar5->string,"",0x50);
    }
    memset(mon,0,0x1f0);
    c->mon_cnt = c->mon_cnt - 1;
    square_light_spot(c,lVar2);
    return;
  }
  __assert_fail("square_in_bounds(c, mon->grid)",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                ,0x38b,"void delete_monster_idx(struct chunk *, int)");
}

Assistant:

void delete_monster_idx(struct chunk *c, int m_idx)
{
	struct monster *mon = cave_monster(c, m_idx);
	struct loc grid;

	assert(m_idx > 0);
	assert(square_in_bounds(c, mon->grid));
	grid = mon->grid;

	/* Hack -- Reduce the racial counter */
	if (mon->original_race) mon->original_race->cur_num--;
	else mon->race->cur_num--;

	/* Count the number of "reproducers" */
	if (rf_has(mon->race->flags, RF_MULTIPLY)) {
		c->num_repro--;
	}

	/* Affect light? */
	if (mon->race->light != 0)
		player->upkeep->update |= PU_UPDATE_VIEW | PU_MONSTERS;

	/* Hack -- remove target monster */
	if (target_get_monster() == mon)
		target_set_monster(NULL);

	/* Hack -- remove tracked monster */
	if (player->upkeep->health_who == mon)
		health_track(player->upkeep, NULL);

	/* Hack -- remove any command status */
	if (mon->m_timed[MON_TMD_COMMAND]) {
		(void) player_clear_timed(player, TMD_COMMAND, true, true);
	}

	/* Monster is gone from square and group, and no longer targeted */
	square_set_mon(c, grid, 0);
	monster_remove_from_groups(c, mon);
	monster_remove_from_targets(c, mon);

	/* Free any heatmaps */
	if (mon->noise.grids) {
		heatmap_free(c, mon->noise);
	}
	if (mon->scent.grids) {
		heatmap_free(c, mon->scent);
	}

	/* Delete objects */
	struct object *obj = mon->held_obj;
	while (obj) {
		struct object *next = obj->next;

		/* Preserve unseen artifacts (we assume they were created as this
		 * monster's drop) - this will cause unintended behaviour in preserve
		 * off mode if monsters can pick up artifacts */
		if (obj->artifact && !obj_is_known_artifact(obj)) {
			mark_artifact_created(obj->artifact, false);
		}

		/* Delete the object.  Since it's in the cave's list do
		 * some additional bookkeeping. */
		if (obj->known) {
			/* It's not in a floor pile so remove it completely.
			 * Once compatibility with old savefiles isn't needed
			 * can skip the test and simply delist and delete
			 * since any obj->known from a monster's inventory
			 * will not be in a floor pile. */
			if (loc_is_zero(obj->known->grid) && (c == cave)) {
				delist_object(player->cave, obj->known);
				object_delete(player->cave, NULL, &obj->known);
			}
		}
		delist_object(c, obj);
		object_delete(c, (player && c == cave) ? player->cave : NULL,
			&obj);
		obj = next;
	}

	/* Delete mimicked objects */
	if (mon->mimicked_obj) {
		square_delete_object(c, mon->grid, mon->mimicked_obj, true, false);
	}

	/* If the monster was a player ghost, remove it from the monster memory,
	 * ensure that it never appears again, clear its data and allow the
	 * next ghost to speak. */
	if (rf_has(mon->race->flags, RF_PLAYER_GHOST)) {
		struct monster_lore *lore = get_lore(mon->race);
		lore->sights = 0;
		lore->deaths = 0;
		lore->pkills = 0;
		lore->tkills = 0;
		if (player->upkeep->monster_race == mon->race) {
			player->upkeep->monster_race = NULL;
		}
		c->ghost->bones_selector = 0;
		c->ghost->has_spoken = false;
		c->ghost->string_type = 0;
		my_strcpy(c->ghost->string, "", sizeof(c->ghost->string));
	}

	/* Wipe the Monster */
	memset(mon, 0, sizeof(struct monster));

	/* Count monsters */
	c->mon_cnt--;

	/* Visual update */
	square_light_spot(c, grid);
}